

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_mod_hdrs(nt_opts *opts)

{
  FILE *__stream;
  int iVar1;
  nifti_image *nim_00;
  float *data;
  size_t sVar2;
  char *pcVar3;
  int local_74;
  char local_4d [8];
  char func [13];
  char *dupname;
  char *fname;
  int swap;
  int filec;
  nifti_image *nim;
  nifti_1_header *nhdr;
  nt_opts *opts_local;
  
  builtin_strncpy(local_4d,"act_mod_",8);
  builtin_strncpy(func,"hdrs",5);
  nhdr = (nifti_1_header *)opts;
  if (2 < g_debug) {
    fprintf(_stderr,"-d modifying %d fields for %d nifti headers...\n",
            (ulong)(uint)(opts->flist).len,(ulong)(uint)(opts->infiles).len);
  }
  if ((0 < *(int *)(nhdr->descrip + 0x3c)) && (0 < *(int *)(nhdr->aux_file + 0xc))) {
    for (fname._4_4_ = 0; fname._4_4_ < *(int *)(nhdr->aux_file + 0xc);
        fname._4_4_ = fname._4_4_ + 1) {
      dupname = *(char **)(*(long *)(nhdr->aux_file + 0x14) + (long)fname._4_4_ * 8);
      iVar1 = nifti_is_gzfile(dupname);
      if (iVar1 == 0) {
        nim = (nifti_image *)nt_read_header((nt_opts *)nhdr,dupname,(int *)&fname,0);
        if (nim == (nifti_image *)0x0) {
          return 1;
        }
        if (1 < g_debug) {
          fprintf(_stderr,"-d modifying %d fields of \'%s\' header\n",
                  (ulong)*(uint *)(nhdr->descrip + 0x3c),dupname);
          __stream = _stderr;
          iVar1 = nifti_hdr_looks_good((nifti_1_header *)nim);
          pcVar3 = "invalid";
          if (iVar1 != 0) {
            pcVar3 = "valid";
          }
          fprintf(__stream,"-d header is: %s\n",pcVar3);
        }
        iVar1 = modify_all_fields(nim,(nt_opts *)nhdr,g_hdr_fields,0x2b);
        if (iVar1 != 0) {
          free(nim);
          return 1;
        }
        func[5] = '\0';
        func[6] = '\0';
        func[7] = '\0';
        func[8] = '\0';
        func[9] = '\0';
        func[10] = '\0';
        func[0xb] = '\0';
        func[0xc] = '\0';
        if (*(long *)(nhdr->descrip + 0x14) == 0) {
          if ((int)fname != 0) {
            if ((((*(char *)((nim->qto_ijk).m[3] + 3) == 'n') &&
                 (*(char *)((long)(nim->qto_ijk).m[3] + 0xf) == '\0')) &&
                ((*(char *)((long)(nim->qto_ijk).m[3] + 0xd) == 'i' ||
                 (*(char *)((long)(nim->qto_ijk).m[3] + 0xd) == '+')))) &&
               (('0' < *(char *)((long)(nim->qto_ijk).m[3] + 0xe) &&
                (*(char *)((long)(nim->qto_ijk).m[3] + 0xe) < ':')))) {
              local_74 = *(char *)((long)(nim->qto_ijk).m[3] + 0xe) + -0x30;
            }
            else {
              local_74 = 0;
            }
            swap_nifti_header((nifti_1_header *)nim,local_74);
          }
        }
        else {
          nim_00 = nt_image_read((nt_opts *)nhdr,dupname,1);
          _swap = nim_00;
          if (nim_00 == (nifti_image *)0x0) {
            fprintf(_stderr,"** failed to dup file \'%s\' before modifying\n",dupname);
            return 1;
          }
          if (*(int *)(nhdr->descrip + 0xc) != 0) {
            data = &nhdr->quatern_b;
            sVar2 = strlen((char *)&nhdr->quatern_b);
            iVar1 = nifti_add_extension(nim_00,(char *)data,(int)sVar2,6);
            if (iVar1 != 0) {
              fprintf(_stderr,"** failed to add command to image as exten\n");
            }
          }
          iVar1 = nifti_set_filenames(_swap,*(char **)(nhdr->descrip + 0x14),1,1);
          if (iVar1 != 0) {
            fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_4d,
                    "failed to set prefix for new file: ",*(undefined8 *)(nhdr->descrip + 0x14));
            nifti_image_free(_swap);
            return 1;
          }
          dupname = nifti_strdup(_swap->fname);
          func._5_8_ = dupname;
          nifti_image_write(_swap);
          if (0x15b < _swap->iname_offset) {
            nim->pixdim[0] = (float)_swap->iname_offset;
          }
          nifti_image_free(_swap);
        }
        write_hdr_to_file((nifti_1_header *)nim,dupname);
        if (func._5_8_ != 0) {
          free((void *)func._5_8_);
        }
        free(nim);
      }
      else {
        fprintf(_stderr,"** sorry, cannot modify a gzipped file: %s\n",dupname);
      }
    }
  }
  return 0;
}

Assistant:

int act_mod_hdrs( nt_opts * opts )
{
   nifti_1_header * nhdr;
   nifti_image    * nim;         /* for reading/writing entire datasets */
   int              filec, swap;
   char           * fname, * dupname;
   char             func[] = { "act_mod_hdrs" };

   if( g_debug > 2 )
      fprintf(stderr,"-d modifying %d fields for %d nifti headers...\n",
              opts->flist.len, opts->infiles.len);
   if( opts->flist.len <= 0 || opts->infiles.len <= 0 ) return 0;

   for( filec = 0; filec < opts->infiles.len; filec++ )
   {
      fname = opts->infiles.list[filec];  /* for convenience and mod file */

      if( nifti_is_gzfile(fname) ){
         fprintf(stderr,"** sorry, cannot modify a gzipped file: %s\n", fname);
         continue;
      }

      /* do not validate the header structure */
      nhdr = nt_read_header(opts, fname, &swap, 0);
      if( !nhdr ) return 1;

      if( g_debug > 1 )
      {
         fprintf(stderr,"-d modifying %d fields of '%s' header\n",
                 opts->flist.len, fname);
         fprintf(stderr,"-d header is: %s\n",
                 nifti_hdr_looks_good(nhdr) ? "valid" : "invalid");
      }

      /* okay, let's actually trash the data fields */
      if( modify_all_fields(nhdr, opts, g_hdr_fields, NT_HDR_NUM_FIELDS) )
      {
         free(nhdr);
         return 1;
      }

      dupname = NULL;                     /* unless we duplicate file   */

      /* possibly duplicate the current dataset before writing new header */
      if( opts->prefix )
      {
         nim = nt_image_read(opts, fname, 1); /* get data */
         if( !nim ) {
            fprintf(stderr,"** failed to dup file '%s' before modifying\n",
                    fname);
            return 1;
         }
         if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                                strlen(opts->command), NIFTI_ECODE_COMMENT) )
               fprintf(stderr,"** failed to add command to image as exten\n");
         if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
         {
            NTL_FERR(func,"failed to set prefix for new file: ",opts->prefix);
            nifti_image_free(nim);
            return 1;
         }
         dupname = nifti_strdup(nim->fname);  /* so we know to free it */
         fname = dupname;
         nifti_image_write(nim);  /* create the duplicate file */
         /* if we added a history note, get the new offset into the header */
         /* mod: if the new offset is valid, use it    31 Jan 2006 [rickr] */
         if( nim->iname_offset >= 348 ) nhdr->vox_offset = nim->iname_offset;
         nifti_image_free(nim);
      }
      else if ( swap )
         swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));

      /* if all is well, overwrite header in fname dataset */
      (void)write_hdr_to_file(nhdr, fname); /* errors printed in function */

      if( dupname ) free(dupname);
      free(nhdr);
   }

   return 0;
}